

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_flushsend(pingpong *pp)

{
  connectdata *pcVar1;
  timeval tVar2;
  void *local_40;
  __suseconds_t local_38;
  CURLcode result;
  curl_socket_t sock;
  ssize_t written;
  connectdata *conn;
  pingpong *pp_local;
  
  written = (ssize_t)pp->conn;
  conn = (connectdata *)pp;
  pp_local._4_4_ =
       Curl_write((connectdata *)written,((connectdata *)written)->sock[0],
                  pp->sendthis + (pp->sendsize - pp->sendleft),pp->sendleft,(ssize_t *)&result);
  if (pp_local._4_4_ == CURLE_OK) {
    if (_result == (conn->chunk).dataleft) {
      (*Curl_cfree)((void *)(conn->chunk).datasize);
      pcVar1 = conn;
      (conn->chunk).datasize = 0;
      conn->fclosesocket = (curl_closesocket_callback)0x0;
      (conn->chunk).dataleft = 0;
      tVar2 = curlx_tvnow();
      local_40 = (void *)tVar2.tv_sec;
      pcVar1->closesocket_client = local_40;
      local_38 = tVar2.tv_usec;
      *(__suseconds_t *)&pcVar1->inuse = local_38;
    }
    else {
      (conn->chunk).dataleft = (conn->chunk).dataleft - _result;
    }
    pp_local._4_4_ = CURLE_OK;
  }
  return pp_local._4_4_;
}

Assistant:

CURLcode Curl_pp_flushsend(struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  struct connectdata *conn = pp->conn;
  ssize_t written;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  CURLcode result = Curl_write(conn, sock, pp->sendthis + pp->sendsize -
                               pp->sendleft, pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    free(pp->sendthis);
    pp->sendthis=NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_tvnow();
  }
  return CURLE_OK;
}